

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::PushItemFlag(ImGuiItemFlags option,bool enabled)

{
  int *piVar1;
  uint uVar2;
  int iVar3;
  int *piVar4;
  ImGuiContext *pIVar5;
  int *__dest;
  int iVar6;
  uint uVar7;
  undefined7 in_register_00000031;
  ImGuiContext *ctx;
  int iVar8;
  
  pIVar5 = GImGui;
  uVar2 = (GImGui->CurrentWindow->DC).ItemFlags;
  uVar7 = uVar2 | option;
  if ((int)CONCAT71(in_register_00000031,enabled) == 0) {
    uVar7 = ~option & uVar2;
  }
  (GImGui->CurrentWindow->DC).ItemFlags = uVar7;
  iVar8 = (pIVar5->ItemFlagsStack).Size;
  iVar3 = (pIVar5->ItemFlagsStack).Capacity;
  if (iVar8 == iVar3) {
    iVar8 = iVar8 + 1;
    if (iVar3 == 0) {
      iVar6 = 8;
    }
    else {
      iVar6 = iVar3 / 2 + iVar3;
    }
    if (iVar8 < iVar6) {
      iVar8 = iVar6;
    }
    if (iVar3 < iVar8) {
      if (pIVar5 != (ImGuiContext *)0x0) {
        piVar4 = &(pIVar5->IO).MetricsActiveAllocations;
        *piVar4 = *piVar4 + 1;
      }
      __dest = (int *)(*GImAllocatorAllocFunc)((long)iVar8 << 2,GImAllocatorUserData);
      piVar4 = (pIVar5->ItemFlagsStack).Data;
      if (piVar4 != (int *)0x0) {
        memcpy(__dest,piVar4,(long)(pIVar5->ItemFlagsStack).Size << 2);
        piVar4 = (pIVar5->ItemFlagsStack).Data;
        if ((piVar4 != (int *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
          piVar1 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + -1;
        }
        (*GImAllocatorFreeFunc)(piVar4,GImAllocatorUserData);
      }
      (pIVar5->ItemFlagsStack).Data = __dest;
      (pIVar5->ItemFlagsStack).Capacity = iVar8;
    }
  }
  (pIVar5->ItemFlagsStack).Data[(pIVar5->ItemFlagsStack).Size] = uVar7;
  (pIVar5->ItemFlagsStack).Size = (pIVar5->ItemFlagsStack).Size + 1;
  return;
}

Assistant:

void ImGui::PushItemFlag(ImGuiItemFlags option, bool enabled)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    ImGuiItemFlags item_flags = window->DC.ItemFlags;
    IM_ASSERT(item_flags == g.ItemFlagsStack.back());
    if (enabled)
        item_flags |= option;
    else
        item_flags &= ~option;
    window->DC.ItemFlags = item_flags;
    g.ItemFlagsStack.push_back(item_flags);
}